

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::ISODayOfWeekOperator>
               (interval_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  long *plVar1;
  reference input;
  Vector *result;
  idx_t i;
  long *row_idx;
  interval_t input_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
LAB_00cb04f8:
      input_00.micros = (int64_t)result_data;
      input_00._0_8_ = ldata;
      DatePart::ISODayOfWeekOperator::Operation<duckdb::interval_t,long>(input_00);
      input = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)ldata,0);
      GenericExecute<duckdb::date_t,long,duckdb::DatePart::PartOperator<duckdb::DatePart::DayOfYearOperator>>
                (input,result,ldata[1].micros,(void *)0x0,true);
      return;
    }
  }
  else {
    for (row_idx = (long *)0x0; (long *)count != row_idx; row_idx = (long *)((long)row_idx + 1)) {
      plVar1 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        plVar1 = (long *)(ulong)sel_vector->sel_vector[(long)row_idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)plVar1 >> 6] >>
           ((ulong)plVar1 & 0x3f) & 1) != 0) goto LAB_00cb04f8;
      result_data = row_idx;
      ldata = (interval_t *)result_mask;
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,(idx_t)row_idx);
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}